

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDrainer.cpp
# Opt level: O2

void __thiscall
adios2::burstbuffer::FileDrainer::AddOperation(FileDrainer *this,FileDrainOperation *operation)

{
  std::mutex::lock(&this->operationsMutex);
  std::
  deque<adios2::burstbuffer::FileDrainOperation,_std::allocator<adios2::burstbuffer::FileDrainOperation>_>
  ::push_back(&(this->operations).c,operation);
  pthread_mutex_unlock((pthread_mutex_t *)&this->operationsMutex);
  return;
}

Assistant:

void FileDrainer::AddOperation(FileDrainOperation &operation)
{
    std::lock_guard<std::mutex> lockGuard(operationsMutex);
    operations.push(operation);
}